

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O3

void thread_main(void *arg)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uv_handle_t *handle;
  char buf [4096];
  undefined1 auStack_1018 [4104];
  
  uv_barrier_wait((uv_barrier_t *)arg);
  while( true ) {
    do {
      handle = (uv_handle_t *)(ulong)*(uint *)((long)arg + 0x20);
      sVar2 = read(*(uint *)((long)arg + 0x20),auStack_1018,0x1000);
    } while (0 < sVar2);
    if (sVar2 != -1) break;
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
LAB_00163eae:
      thread_main_cold_1();
      iVar1 = uv_is_closing(handle);
      if (iVar1 == 0) {
        uv_close(handle,(uv_close_cb)0x0);
        return;
      }
      return;
    }
  }
  if (sVar2 == 0) {
    return;
  }
  goto LAB_00163eae;
}

Assistant:

static void thread_main(void* arg) {
  struct thread_ctx* ctx;
  char buf[4096];
  ssize_t n;

  ctx = arg;
  uv_barrier_wait(&ctx->barrier);

  do
    n = read(ctx->fd, buf, sizeof(buf));
  while (n > 0 || (n == -1 && errno == EINTR));

  ASSERT(n == 0);
}